

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rshapes.c
# Opt level: O1

void DrawCircleGradient(int centerX,int centerY,float radius,Color inner,Color outer)

{
  uint uVar1;
  uint uVar2;
  float x;
  float y;
  float fVar3;
  float fVar4;
  undefined1 local_44;
  
  rlBegin(4);
  x = (float)centerX;
  y = (float)centerY;
  local_44 = outer.r;
  uVar2 = 0xfffffff6;
  do {
    uVar1 = uVar2 + 10;
    rlColor4ub(inner.r,inner.g,inner.b,inner.a);
    rlVertex2f(x,y);
    rlColor4ub(local_44,outer.g,outer.b,outer.a);
    fVar4 = (float)(int)(uVar2 + 0x14) * 0.017453292;
    fVar3 = cosf(fVar4);
    fVar4 = sinf(fVar4);
    rlVertex2f(fVar3 * radius + x,fVar4 * radius + y);
    rlColor4ub(local_44,outer.g,outer.b,outer.a);
    fVar3 = cosf((float)(int)uVar1 * 0.017453292);
    fVar4 = sinf((float)(int)uVar1 * 0.017453292);
    rlVertex2f(fVar3 * radius + x,fVar4 * radius + y);
    uVar2 = uVar1;
  } while (uVar1 < 0x15e);
  rlEnd();
  return;
}

Assistant:

void DrawCircleGradient(int centerX, int centerY, float radius, Color inner, Color outer)
{
    rlBegin(RL_TRIANGLES);
        for (int i = 0; i < 360; i += 10)
        {
            rlColor4ub(inner.r, inner.g, inner.b, inner.a);
            rlVertex2f((float)centerX, (float)centerY);
            rlColor4ub(outer.r, outer.g, outer.b, outer.a);
            rlVertex2f((float)centerX + cosf(DEG2RAD*(i + 10))*radius, (float)centerY + sinf(DEG2RAD*(i + 10))*radius);
            rlColor4ub(outer.r, outer.g, outer.b, outer.a);
            rlVertex2f((float)centerX + cosf(DEG2RAD*i)*radius, (float)centerY + sinf(DEG2RAD*i)*radius);
        }
    rlEnd();
}